

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O3

int libssh2_userauth_banner(LIBSSH2_SESSION *session,char **banner)

{
  int iVar1;
  
  if (session == (LIBSSH2_SESSION *)0x0) {
    return -0x32;
  }
  if (session->userauth_banner != (char *)0x0) {
    if (banner != (char **)0x0) {
      *banner = session->userauth_banner;
    }
    return 0;
  }
  iVar1 = _libssh2_error(session,-0x32,"Missing userauth banner");
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_banner(LIBSSH2_SESSION *session, char **banner)
{
    if(!session)
        return LIBSSH2_ERROR_MISSING_USERAUTH_BANNER;

    if(!session->userauth_banner) {
        return _libssh2_error(session,
                              LIBSSH2_ERROR_MISSING_USERAUTH_BANNER,
                              "Missing userauth banner");
    }

    if(banner)
        *banner = session->userauth_banner;

    return LIBSSH2_ERROR_NONE;
}